

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
* __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::
emplace<std::__cxx11::string_const&,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>>
          (pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
           *__return_storage_ptr__,
          Table<true,80ul,std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>
          *args_1)

{
  function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)> *pfVar1;
  Node n;
  DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  local_58;
  
  pair<std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>>
  ::
  pair<std::__cxx11::string_const&,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>>
            ((pair<std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>>
              *)&local_58,args,args_1);
  doInsert<robin_hood::detail::Table<true,80ul,std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,std::function<Rml::Variant(std::vector<Rml::Variant,std::allocator<Rml::Variant>>const&)>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>>
            (__return_storage_ptr__,this,&local_58);
  if (local_58.mData.second.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &local_58.mData.second;
    (*local_58.mData.second.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.mData.first._M_dataplus._M_p != &local_58.mData.first.field_2) {
    operator_delete(local_58.mData.first._M_dataplus._M_p,
                    local_58.mData.first.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace(Args&&... args) {
        ROBIN_HOOD_TRACE(this)
        Node n{*this, std::forward<Args>(args)...};
        auto r = doInsert(std::move(n));
        if (!r.second) {
            // insertion not possible: destroy node
            // NOLINTNEXTLINE(bugprone-use-after-move)
            n.destroy(*this);
        }
        return r;
    }